

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hh
# Opt level: O3

void hgdb::json::SymbolTable::walk_up<false>
               (ScopeBase *scope,function<bool_(hgdb::json::ScopeBase_*)> *terminate)

{
  ScopeBase *scope_00;
  uint64_t uVar1;
  bool bVar2;
  _Head_base<0UL,_hgdb::json::ScopeBase_*,_false> local_30;
  
  scope_00 = scope->parent;
  if (scope_00 != (ScopeBase *)0x0) {
    uVar1 = scope->index_;
    do {
      bVar2 = uVar1 == 0;
      uVar1 = uVar1 - 1;
      if (bVar2) {
        walk_up<false>(scope_00,terminate);
        return;
      }
      local_30._M_head_impl =
           *(ScopeBase **)
            &(scope_00->scopes_).
             super__Vector_base<std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>,_std::allocator<std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar1]._M_t.
             super___uniq_ptr_impl<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>
             ._M_t;
      if ((terminate->super__Function_base)._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
      }
      bVar2 = (*terminate->_M_invoker)((_Any_data *)terminate,(ScopeBase **)&local_30);
    } while (!bVar2);
  }
  return;
}

Assistant:

static void walk_up(ScopeBase *scope, const std::function<bool(ScopeBase *)> &terminate) {
        auto *parent = scope->parent;
        if (!parent) return;
        if constexpr (include_current) {
            // NOLINTNEXTLINE
            for (auto child = scope->rbegin(); child != scope->rend(); child++) {
                auto res = terminate(child->get());
                if (res) return;
            }
        }

        for (auto i = scope->index_; i > 0; i--) {
            auto &s = parent->operator[](i - 1);
            auto res = terminate(&s);
            if (res) return;
        }
        walk_up<false>(parent, terminate);
    }